

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

int16_t calc_slot_mod(EOPLL *opll,int ch)

{
  byte bVar1;
  int16_t iVar2;
  EOPLL_SLOT *slot_00;
  short local_28;
  uint8_t am;
  int16_t fm;
  EOPLL_SLOT *slot;
  int ch_local;
  EOPLL *opll_local;
  
  slot_00 = opll->slot + (ch << 1);
  if (slot_00->patch->FB == 0) {
    local_28 = 0;
  }
  else {
    local_28 = (short)(slot_00->output[1] + slot_00->output[0] >>
                      (9U - (char)slot_00->patch->FB & 0x1f));
  }
  if (slot_00->patch->AM == 0) {
    bVar1 = 0;
  }
  else {
    bVar1 = opll->lfo_am;
  }
  slot_00->output[1] = slot_00->output[0];
  iVar2 = to_linear(slot_00->wave_table[slot_00->pg_out + (int)local_28 & 0x3ff],slot_00,
                    (ushort)bVar1);
  slot_00->output[0] = (int)iVar2;
  return (int16_t)slot_00->output[0];
}

Assistant:

static INLINE int16_t calc_slot_mod(EOPLL *opll, int ch) {
  EOPLL_SLOT *slot = MOD(opll, ch);

  int16_t fm = slot->patch->FB > 0 ? (slot->output[1] + slot->output[0]) >> (9 - slot->patch->FB) : 0;
  uint8_t am = slot->patch->AM ? opll->lfo_am : 0;

  slot->output[1] = slot->output[0];
  slot->output[0] = to_linear(slot->wave_table[(slot->pg_out + fm) & (PG_WIDTH - 1)], slot, am);

  return slot->output[0];
}